

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cl_half.h.c
# Opt level: O2

int main(void)

{
  int iVar1;
  undefined8 uStack_10;
  
  puts("\nChecking conversion routines in cl_half.h");
  iVar1 = test_half_to_float(0,0.0);
  if (iVar1 == 0) {
    uStack_10 = 0x43;
  }
  else {
    iVar1 = test_half_to_float(0x3c00,1.0);
    if (iVar1 == 0) {
      uStack_10 = 0x44;
    }
    else {
      iVar1 = test_half_to_float(0xbc00,-1.0);
      if (iVar1 == 0) {
        uStack_10 = 0x45;
      }
      else {
        iVar1 = test_half_to_float(0x7c00,INFINITY);
        if (iVar1 == 0) {
          uStack_10 = 0x46;
        }
        else {
          iVar1 = test_half_to_float(0xfc00,-INFINITY);
          if (iVar1 == 0) {
            uStack_10 = 0x47;
          }
          else {
            iVar1 = test_half_from_float(1.0,0x3c00,CL_HALF_RTE,"RTE");
            if (iVar1 == 0) {
              uStack_10 = 0x52;
            }
            else {
              iVar1 = test_half_from_float(-1.0,0xbc00,CL_HALF_RTE,"RTE");
              if (iVar1 == 0) {
                uStack_10 = 0x53;
              }
              else {
                iVar1 = test_half_from_float(65504.0,0x7bff,CL_HALF_RTE,"RTE");
                if (iVar1 == 0) {
                  uStack_10 = 0x54;
                }
                else {
                  iVar1 = test_half_from_float(6.1035156e-05,0x400,CL_HALF_RTE,"RTE");
                  if (iVar1 == 0) {
                    uStack_10 = 0x55;
                  }
                  else {
                    iVar1 = test_half_from_float(2.9802322e-08,0,CL_HALF_RTE,"RTE");
                    if (iVar1 != 0) {
                      iVar1 = test_half_from_float(2.9802322e-08,1,CL_HALF_RTP,"RTP");
                      if (iVar1 == 0) {
                        uStack_10 = 0x71;
                      }
                      else {
                        iVar1 = test_half_from_float(2.9802322e-08,0,CL_HALF_RTN,"RTN");
                        if (iVar1 == 0) {
                          uStack_10 = 0x72;
                        }
                        else {
                          iVar1 = test_half_from_float(2.9802322e-08,0,CL_HALF_RTZ,"RTZ");
                          if (iVar1 == 0) {
                            uStack_10 = 0x73;
                          }
                          else {
                            iVar1 = test_half_from_float(-2.9802322e-08,0x8000,CL_HALF_RTE,"RTE");
                            if (iVar1 == 0) {
                              uStack_10 = 0x76;
                            }
                            else {
                              iVar1 = test_half_from_float(-2.9802322e-08,0x8000,CL_HALF_RTP,"RTP");
                              if (iVar1 == 0) {
                                uStack_10 = 0x77;
                              }
                              else {
                                iVar1 = test_half_from_float
                                                  (-2.9802322e-08,0x8001,CL_HALF_RTN,"RTN");
                                if (iVar1 == 0) {
                                  uStack_10 = 0x78;
                                }
                                else {
                                  iVar1 = test_half_from_float
                                                    (-2.9802322e-08,0x8000,CL_HALF_RTZ,"RTZ");
                                  if (iVar1 != 0) {
                                    puts("\nAll tests passed!");
                                    return 0;
                                  }
                                  uStack_10 = 0x79;
                                }
                              }
                            }
                          }
                        }
                      }
                      printf("Test failed on line %d.\n",uStack_10);
                      return 1;
                    }
                    uStack_10 = 0x70;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  printf("Test failed on line %d.\n",uStack_10);
  return 1;
}

Assistant:

int main(void)
{
  printf("\nChecking conversion routines in cl_half.h\n");

#define CHECK_TO_FLOAT(h, ref)                     \
  if (!test_half_to_float(h, ref)) {               \
    printf("Test failed on line %d.\n", __LINE__); \
    return 1;                                      \
  }

  // Check a handful of values
  CHECK_TO_FLOAT(0x0000, 0.f);
  CHECK_TO_FLOAT(0x3c00, 1.f);
  CHECK_TO_FLOAT(0xbc00, -1.f);
  CHECK_TO_FLOAT(0x7c00, INFINITY);
  CHECK_TO_FLOAT(0xfc00, -INFINITY);


#define CHECK_FROM_FLOAT(f, ref, mode)                         \
  if (!test_half_from_float(f, ref, CL_HALF_##mode, #mode)) {  \
    printf("Test failed on line %d.\n", __LINE__);             \
    return 1;                                                  \
  }

  // Check a handful of normal values
  CHECK_FROM_FLOAT(0.f, 0x0000, RTE);
  CHECK_FROM_FLOAT(1.f, 0x3c00, RTE);
  CHECK_FROM_FLOAT(-1.f, 0xbc00, RTE);
  CHECK_FROM_FLOAT(CL_HALF_MAX, 0x7bff, RTE);
  CHECK_FROM_FLOAT(CL_HALF_MIN, 0x0400, RTE);

  // Check huge positive (non-inf) values round properly
  CHECK_FROM_FLOAT(CL_HALF_MAX + 1000.f, 0x7c00, RTE);
  CHECK_FROM_FLOAT(CL_HALF_MAX + 1000.f, 0x7c00, RTP);
  CHECK_FROM_FLOAT(CL_HALF_MAX + 1000.f, 0x7bff, RTN);
  CHECK_FROM_FLOAT(CL_HALF_MAX + 1000.f, 0x7bff, RTZ);

  // Check huge negative (non-inf) values round properly
  CHECK_FROM_FLOAT(-(CL_HALF_MAX + 1000.f), 0xfc00, RTE);
  CHECK_FROM_FLOAT(-(CL_HALF_MAX + 1000.f), 0xfbff, RTP);
  CHECK_FROM_FLOAT(-(CL_HALF_MAX + 1000.f), 0xfc00, RTN);
  CHECK_FROM_FLOAT(-(CL_HALF_MAX + 1000.f), 0xfbff, RTZ);
#if 0 // Hexadecimal float constant is C++17
  // Check tiny positive values round properly
  CHECK_FROM_FLOAT(0x1.000000p-25, 0x0000, RTE);
  CHECK_FROM_FLOAT(0x1.000000p-25, 0x0001, RTP);
  CHECK_FROM_FLOAT(0x1.000000p-25, 0x0000, RTN);
  CHECK_FROM_FLOAT(0x1.000000p-25, 0x0000, RTZ);

  // Check tiny negative values round properly
  CHECK_FROM_FLOAT(-0x1.000000p-25, 0x8000, RTE);
  CHECK_FROM_FLOAT(-0x1.000000p-25, 0x8000, RTP);
  CHECK_FROM_FLOAT(-0x1.000000p-25, 0x8001, RTN);
  CHECK_FROM_FLOAT(-0x1.000000p-25, 0x8000, RTZ);
#else
  // Check tiny positive values round properly
  CHECK_FROM_FLOAT(2.98023223876953125e-08, 0x0000, RTE);
  CHECK_FROM_FLOAT(2.98023223876953125e-08, 0x0001, RTP);
  CHECK_FROM_FLOAT(2.98023223876953125e-08, 0x0000, RTN);
  CHECK_FROM_FLOAT(2.98023223876953125e-08, 0x0000, RTZ);

  // Check tiny negative values round properly
  CHECK_FROM_FLOAT(-2.98023223876953125e-08, 0x8000, RTE);
  CHECK_FROM_FLOAT(-2.98023223876953125e-08, 0x8000, RTP);
  CHECK_FROM_FLOAT(-2.98023223876953125e-08, 0x8001, RTN);
  CHECK_FROM_FLOAT(-2.98023223876953125e-08, 0x8000, RTZ);
#endif
  printf("\nAll tests passed!\n");

  return 0;
}